

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O3

int32_t icu_63::number::impl::NumberFormatterImpl::writeIntegerDigits
                  (MicroProps *micros,DecimalQuantity *quantity,NumberStringBuilder *string,
                  int32_t index,UErrorCode *status)

{
  DecimalFormatSymbols *pDVar1;
  bool bVar2;
  int8_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  uint uVar6;
  int iVar7;
  UnicodeString *unistr;
  int iVar8;
  int position;
  UnicodeString local_70;
  
  iVar4 = DecimalQuantity::getUpperDisplayMagnitude(quantity);
  if (iVar4 < 0) {
    iVar8 = 0;
  }
  else {
    iVar8 = 0;
    position = 0;
    do {
      bVar2 = Grouper::groupAtPosition(&micros->grouping,position,quantity);
      if (bVar2) {
        UnicodeString::UnicodeString
                  (&local_70,
                   (UnicodeString *)
                   (&micros->symbols->field_0x48 + (ulong)micros->useCurrency * 0x400));
        iVar5 = NumberStringBuilder::insert
                          (string,index,&local_70,UNUM_GROUPING_SEPARATOR_FIELD,status);
        iVar8 = iVar8 + iVar5;
        UnicodeString::~UnicodeString(&local_70);
      }
      iVar3 = DecimalQuantity::getDigit(quantity,position);
      pDVar1 = micros->symbols;
      uVar6 = (uint)iVar3;
      if (pDVar1->fCodePointZero == -1) {
        unistr = (UnicodeString *)(&pDVar1->field_0x448 + (ulong)uVar6 * 0x40);
        if (uVar6 - 10 < 0xfffffff7) {
          unistr = (UnicodeString *)&pDVar1->field_0x108;
        }
        iVar7 = NumberStringBuilder::insert(string,index,unistr,UNUM_INTEGER_FIELD,status);
      }
      else {
        iVar7 = NumberStringBuilder::insertCodePoint
                          (string,index,pDVar1->fCodePointZero + uVar6,UNUM_INTEGER_FIELD,status);
      }
      iVar8 = iVar7 + iVar8;
      position = position + 1;
    } while (iVar4 + 1 != position);
  }
  return iVar8;
}

Assistant:

int32_t NumberFormatterImpl::writeIntegerDigits(const MicroProps& micros, DecimalQuantity& quantity,
                                                NumberStringBuilder& string, int32_t index,
                                                UErrorCode& status) {
    int length = 0;
    int integerCount = quantity.getUpperDisplayMagnitude() + 1;
    for (int i = 0; i < integerCount; i++) {
        // Add grouping separator
        if (micros.grouping.groupAtPosition(i, quantity)) {
            length += string.insert(
                    index,
                    micros.useCurrency ? micros.symbols->getSymbol(
                            DecimalFormatSymbols::ENumberFormatSymbol::kMonetaryGroupingSeparatorSymbol)
                                       : micros.symbols->getSymbol(
                            DecimalFormatSymbols::ENumberFormatSymbol::kGroupingSeparatorSymbol),
                    UNUM_GROUPING_SEPARATOR_FIELD,
                    status);
        }

        // Get and append the next digit value
        int8_t nextDigit = quantity.getDigit(i);
        length += utils::insertDigitFromSymbols(
                string, index, nextDigit, *micros.symbols, UNUM_INTEGER_FIELD, status);
    }
    return length;
}